

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O3

shared_ptr<int> __thiscall
pstore::database::getrw<int,void>(database *this,typed_address<int> addr,size_t elements)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<void> sVar3;
  shared_ptr<int> sVar4;
  _func_int **local_20;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_18;
  
  if ((elements & 3) != 0) {
    raise<pstore::error_code>(bad_alignment);
  }
  sVar3 = getrw((database *)&stack0xffffffffffffffe0,addr.a_.a_,elements);
  _Var2 = sVar3.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  this->_vptr_database = local_20;
  (this->storage_).sat_._M_t.
  super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
       local_18._M_head_impl;
  if (local_18._M_head_impl != (array<pstore::sat_entry,_65536UL> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)(local_18._M_head_impl)->_M_elems + 8);
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
      if (local_18._M_head_impl == (array<pstore::sat_entry,_65536UL> *)0x0) goto LAB_001b9dab;
    }
    else {
      p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)(local_18._M_head_impl)->_M_elems + 8);
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._M_head_impl);
    _Var2._M_pi = extraout_RDX;
  }
LAB_001b9dab:
  sVar4.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar4.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<int>)sVar4.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> getrw (typed_address<T> const addr, std::size_t const elements) {
            if (addr.to_address ().absolute () % alignof (T) != 0) {
                raise (error_code::bad_alignment);
            }
            return std::static_pointer_cast<T> (
                this->getrw (addr.to_address (), sizeof (T) * elements));
        }